

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colormapper.h
# Opt level: O3

vector<float,_std::allocator<float>_> *
irwincolor::msh2rgb(vector<float,_std::allocator<float>_> *__return_storage_ptr__,
                   vector<float,_std::allocator<float>_> *msh)

{
  pointer pfVar1;
  double dVar2;
  double dVar3;
  undefined1 auVar4 [16];
  vector<float,_std::allocator<float>_> local_28;
  
  msh2lab(&local_28,msh);
  lab2rgb(__return_storage_ptr__,&local_28);
  if (local_28.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_28.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_28.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_28.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  pfVar1 = (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
           super__Vector_impl_data._M_start;
  auVar4._0_8_ = (double)(float)*(undefined8 *)pfVar1;
  auVar4._8_8_ = (double)(float)((ulong)*(undefined8 *)pfVar1 >> 0x20);
  auVar4 = maxpd(ZEXT816(0),auVar4);
  auVar4 = minpd(_DAT_00142070,auVar4);
  *(ulong *)pfVar1 = CONCAT44((float)auVar4._8_8_,(float)auVar4._0_8_);
  dVar2 = 0.0;
  if (0.0 <= (double)pfVar1[2]) {
    dVar2 = (double)pfVar1[2];
  }
  dVar3 = 1.0;
  if (dVar2 <= 1.0) {
    dVar3 = dVar2;
  }
  pfVar1[2] = (float)dVar3;
  return __return_storage_ptr__;
}

Assistant:

std::vector<float> msh2rgb(const std::vector<float>& msh)
{
	auto rgb = lab2rgb(msh2lab(msh));
	rgb[0] = std::min(std::max((double) rgb[0], 0.0), 1.0);
	rgb[1] = std::min(std::max((double) rgb[1], 0.0), 1.0);
	rgb[2] = std::min(std::max((double) rgb[2], 0.0), 1.0);
	return rgb;
	//return lab2rgb(msh2lab(msh));
}